

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::AssertData::AssertData
          (AssertData *this,Enum at,char *file,int line,char *expr,char *exception_type,
          StringContains *exception_string)

{
  undefined8 uVar1;
  char *__dest;
  
  this->m_test_case = *(TestCaseData **)(detail::g_cs + 0x20);
  this->m_at = at;
  this->m_file = file;
  this->m_line = line;
  this->m_expr = expr;
  this->m_failed = true;
  this->m_threw = false;
  (this->m_exception).field_0.buf[0] = '\0';
  *(undefined2 *)((long)&(this->m_exception).field_0 + 0x17) = 0x17;
  *(undefined2 *)((long)&(this->m_decomp).field_0 + 0x17) = 0x17;
  this->m_exception_type = exception_type;
  if ((exception_string->content).string.field_0.buf[0x17] < '\0') {
    __dest = String::allocate((String *)&this->m_exception_string,
                              (exception_string->content).string.field_0.data.size);
    memcpy(__dest,(exception_string->content).string.field_0.data.ptr,
           (ulong)(exception_string->content).string.field_0.data.size);
  }
  else {
    *(undefined8 *)((long)&(this->m_exception_string).content.string.field_0 + 0x10) =
         *(undefined8 *)((long)&(exception_string->content).string.field_0 + 0x10);
    uVar1 = *(undefined8 *)((long)&(exception_string->content).string.field_0 + 8);
    (this->m_exception_string).content.string.field_0.data.ptr =
         (exception_string->content).string.field_0.data.ptr;
    *(undefined8 *)((long)&(this->m_exception_string).content.string.field_0 + 8) = uVar1;
  }
  (this->m_exception_string).isContains = exception_string->isContains;
  return;
}

Assistant:

AssertData::AssertData(assertType::Enum at, const char* file, int line, const char* expr,
    const char* exception_type, const StringContains& exception_string)
    : m_test_case(g_cs->currentTest), m_at(at), m_file(file), m_line(line), m_expr(expr),
    m_failed(true), m_threw(false), m_threw_as(false), m_exception_type(exception_type),
    m_exception_string(exception_string) {
#if DOCTEST_MSVC
    if (m_expr[0] == ' ') // this happens when variadic macros are disabled under MSVC
        ++m_expr;
#endif // MSVC
}